

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O1

cave_profile * find_cave_profile(char *name)

{
  int iVar1;
  cave_profile *profile;
  cave_profile *pcVar2;
  ulong uVar3;
  
  uVar3 = (ulong)z_info->profile_max;
  pcVar2 = cave_profiles;
  while( true ) {
    if (uVar3 == 0) {
      return (cave_profile *)0x0;
    }
    iVar1 = strcmp(name,pcVar2->name);
    if (iVar1 == 0) break;
    pcVar2 = pcVar2 + 1;
    uVar3 = uVar3 - 1;
  }
  return pcVar2;
}

Assistant:

static const struct cave_profile *find_cave_profile(const char *name)
{
	int i;

	for (i = 0; i < z_info->profile_max; i++) {
		const struct cave_profile *profile;

		profile = &cave_profiles[i];
		if (streq(name, profile->name))
			return profile;
	}

	/* Not there */
	return NULL;
}